

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

int mpc_parse_run(mpc_input_t *i,mpc_parser_t *p,mpc_result_t *r,mpc_err_t **e,int depth)

{
  int iVar1;
  mpc_err_t *pmVar2;
  mpc_result_t mVar3;
  mpc_result_t mVar4;
  mpc_val_t *pmVar5;
  mpc_result_t **local_a8;
  mpc_result_t **local_a0;
  mpc_result_t **local_98;
  int local_74;
  mpc_result_t **ppmStack_70;
  int results_slots;
  mpc_result_t *results;
  mpc_result_t results_stk [4];
  int local_3c;
  int local_38;
  int k;
  int j;
  int depth_local;
  mpc_err_t **e_local;
  mpc_result_t *r_local;
  mpc_parser_t *p_local;
  mpc_input_t *i_local;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  local_38 = 0;
  local_74 = 4;
  if (depth == 1000) {
    pmVar2 = mpc_err_fail(i,"Maximum recursion depth exceeded!");
    r->error = pmVar2;
    i_local._4_4_ = 0;
  }
  else {
    switch(p->type) {
    case '\0':
      pmVar2 = mpc_err_fail(i,"Parser Undefined!");
      r->error = pmVar2;
      i_local._4_4_ = 0;
      break;
    case '\x01':
      r->error = (mpc_err_t *)0x0;
      i_local._4_4_ = 1;
      break;
    case '\x02':
      pmVar2 = mpc_err_fail(i,(char *)(p->data).lift.lf);
      r->error = pmVar2;
      i_local._4_4_ = 0;
      break;
    case '\x03':
      pmVar5 = (*(p->data).lift.lf)();
      r->output = pmVar5;
      i_local._4_4_ = 1;
      break;
    case '\x04':
      *r = (mpc_result_t)(p->data).lift.x;
      i_local._4_4_ = 1;
      break;
    case '\x05':
      mpc_input_suppress_enable(i);
      iVar1 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
      if (iVar1 == 0) {
        mpc_input_suppress_disable(i);
        pmVar2 = mpc_err_new(i,(p->data).expect.m);
        r->error = pmVar2;
        i_local._4_4_ = 0;
      }
      else {
        mpc_input_suppress_disable(i);
        *r = *r;
        i_local._4_4_ = 1;
      }
      break;
    case '\x06':
      iVar1 = mpc_input_anchor(i,(_func_int_char_char *)(p->data).lift.lf,(char **)&r->error);
      if (iVar1 == 0) {
        r->error = (mpc_err_t *)0x0;
        i_local._4_4_ = 0;
      }
      else {
        *r = *r;
        i_local._4_4_ = 1;
      }
      break;
    case '\a':
      pmVar2 = (mpc_err_t *)mpc_input_state_copy(i);
      r->error = pmVar2;
      i_local._4_4_ = 1;
      break;
    case '\b':
      iVar1 = mpc_input_any(i,(char **)&r->error);
      if (iVar1 == 0) {
        r->error = (mpc_err_t *)0x0;
        i_local._4_4_ = 0;
      }
      else {
        *r = *r;
        i_local._4_4_ = 1;
      }
      break;
    case '\t':
      iVar1 = mpc_input_char(i,(p->data).range.x,(char **)&r->error);
      if (iVar1 == 0) {
        r->error = (mpc_err_t *)0x0;
        i_local._4_4_ = 0;
      }
      else {
        *r = *r;
        i_local._4_4_ = 1;
      }
      break;
    case '\n':
      iVar1 = mpc_input_oneof(i,(char *)(p->data).lift.lf,(char **)&r->error);
      if (iVar1 == 0) {
        r->error = (mpc_err_t *)0x0;
        i_local._4_4_ = 0;
      }
      else {
        *r = *r;
        i_local._4_4_ = 1;
      }
      break;
    case '\v':
      iVar1 = mpc_input_noneof(i,(char *)(p->data).lift.lf,(char **)&r->error);
      if (iVar1 == 0) {
        r->error = (mpc_err_t *)0x0;
        i_local._4_4_ = 0;
      }
      else {
        *r = *r;
        i_local._4_4_ = 1;
      }
      break;
    case '\f':
      iVar1 = mpc_input_range(i,(p->data).range.x,(p->data).range.y,(char **)&r->error);
      if (iVar1 == 0) {
        r->error = (mpc_err_t *)0x0;
        i_local._4_4_ = 0;
      }
      else {
        *r = *r;
        i_local._4_4_ = 1;
      }
      break;
    case '\r':
      iVar1 = mpc_input_satisfy(i,(_func_int_char *)(p->data).lift.lf,(char **)&r->error);
      if (iVar1 == 0) {
        r->error = (mpc_err_t *)0x0;
        i_local._4_4_ = 0;
      }
      else {
        *r = *r;
        i_local._4_4_ = 1;
      }
      break;
    case '\x0e':
      iVar1 = mpc_input_string(i,(char *)(p->data).lift.lf,(char **)&r->error);
      if (iVar1 == 0) {
        r->error = (mpc_err_t *)0x0;
        i_local._4_4_ = 0;
      }
      else {
        *r = *r;
        i_local._4_4_ = 1;
      }
      break;
    case '\x0f':
      iVar1 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
      if (iVar1 == 0) {
        *r = *r;
        i_local._4_4_ = 0;
      }
      else {
        pmVar5 = mpc_parse_apply(i,(p->data).apply.f,r->output);
        r->output = pmVar5;
        i_local._4_4_ = 1;
      }
      break;
    case '\x10':
      iVar1 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
      if (iVar1 == 0) {
        *r = *r;
        i_local._4_4_ = 0;
      }
      else {
        pmVar5 = mpc_parse_apply_to(i,(p->data).apply_to.f,r->output,(p->data).apply_to.d);
        r->output = pmVar5;
        i_local._4_4_ = 1;
      }
      break;
    case '\x11':
      mpc_input_backtrack_disable(i);
      iVar1 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
      if (iVar1 == 0) {
        mpc_input_backtrack_enable(i);
        *r = *r;
        i_local._4_4_ = 0;
      }
      else {
        mpc_input_backtrack_enable(i);
        *r = *r;
        i_local._4_4_ = 1;
      }
      break;
    case '\x12':
      mpc_input_mark(i);
      mpc_input_suppress_enable(i);
      iVar1 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
      if (iVar1 == 0) {
        mpc_input_unmark(i);
        mpc_input_suppress_disable(i);
        mVar3._0_4_ = (*(p->data).check.f)((mpc_val_t **)i);
        mVar3._4_4_ = extraout_var;
        *r = mVar3;
        i_local._4_4_ = 1;
      }
      else {
        mpc_input_rewind(i);
        mpc_input_suppress_disable(i);
        mpc_parse_dtor(i,(p->data).check.dx,r->output);
        pmVar2 = mpc_err_new(i,"opposite");
        r->error = pmVar2;
        i_local._4_4_ = 0;
      }
      break;
    case '\x13':
      iVar1 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
      if (iVar1 == 0) {
        pmVar2 = mpc_err_merge(i,*e,r->error);
        *e = pmVar2;
        mVar4._0_4_ = (*(p->data).check.f)((mpc_val_t **)i);
        mVar4._4_4_ = extraout_var_00;
        *r = mVar4;
        i_local._4_4_ = 1;
      }
      else {
        *r = *r;
        i_local._4_4_ = 1;
      }
      break;
    case '\x14':
      ppmStack_70 = &results;
      while (iVar1 = mpc_parse_run(i,(p->data).repeat.x,(mpc_result_t *)(ppmStack_70 + local_38),e,
                                   depth + 1), iVar1 != 0) {
        local_38 = local_38 + 1;
        if (local_38 == 4) {
          local_74 = 6;
          ppmStack_70 = (mpc_result_t **)mpc_malloc(i,0x30);
          *ppmStack_70 = results;
          *(mpc_result_t *)(ppmStack_70 + 1) = results_stk[0];
          *(mpc_result_t *)(ppmStack_70 + 2) = results_stk[1];
          *(mpc_result_t *)(ppmStack_70 + 3) = results_stk[2];
        }
        else if (local_74 <= local_38) {
          local_74 = local_38 + local_38 / 2;
          ppmStack_70 = (mpc_result_t **)mpc_realloc(i,ppmStack_70,(long)local_74 << 3);
        }
      }
      pmVar2 = mpc_err_merge(i,*e,(mpc_err_t *)ppmStack_70[local_38]);
      *e = pmVar2;
      pmVar5 = mpc_parse_fold(i,(p->data).repeat.f,local_38,ppmStack_70);
      r->output = pmVar5;
      if (3 < local_38) {
        mpc_free(i,ppmStack_70);
      }
      i_local._4_4_ = 1;
      break;
    case '\x15':
      ppmStack_70 = &results;
      while (iVar1 = mpc_parse_run(i,(p->data).repeat.x,(mpc_result_t *)(ppmStack_70 + local_38),e,
                                   depth + 1), iVar1 != 0) {
        local_38 = local_38 + 1;
        if (local_38 == 4) {
          local_74 = 6;
          ppmStack_70 = (mpc_result_t **)mpc_malloc(i,0x30);
          *ppmStack_70 = results;
          *(mpc_result_t *)(ppmStack_70 + 1) = results_stk[0];
          *(mpc_result_t *)(ppmStack_70 + 2) = results_stk[1];
          *(mpc_result_t *)(ppmStack_70 + 3) = results_stk[2];
        }
        else if (local_74 <= local_38) {
          local_74 = local_38 + local_38 / 2;
          ppmStack_70 = (mpc_result_t **)mpc_realloc(i,ppmStack_70,(long)local_74 << 3);
        }
      }
      if (local_38 == 0) {
        pmVar2 = mpc_err_many1(i,(mpc_err_t *)*ppmStack_70);
        r->error = pmVar2;
        i_local._4_4_ = 0;
      }
      else {
        pmVar2 = mpc_err_merge(i,*e,(mpc_err_t *)ppmStack_70[local_38]);
        *e = pmVar2;
        pmVar5 = mpc_parse_fold(i,(p->data).repeat.f,local_38,ppmStack_70);
        r->output = pmVar5;
        if (3 < local_38) {
          mpc_free(i,ppmStack_70);
        }
        i_local._4_4_ = 1;
      }
      break;
    case '\x16':
      if ((p->data).repeat.n < 5) {
        local_98 = &results;
      }
      else {
        local_98 = (mpc_result_t **)mpc_malloc(i,(long)(p->data).repeat.n << 3);
      }
      do {
        iVar1 = mpc_parse_run(i,(p->data).repeat.x,(mpc_result_t *)(local_98 + local_38),e,depth + 1
                             );
        if (iVar1 == 0) break;
        local_38 = local_38 + 1;
      } while (local_38 != (p->data).repeat.n);
      if (local_38 == (p->data).repeat.n) {
        pmVar5 = mpc_parse_fold(i,(p->data).repeat.f,local_38,local_98);
        r->output = pmVar5;
        if (4 < (p->data).repeat.n) {
          mpc_free(i,local_98);
        }
        i_local._4_4_ = 1;
      }
      else {
        for (local_3c = 0; local_3c < local_38; local_3c = local_3c + 1) {
          mpc_parse_dtor(i,(p->data).repeat.dx,local_98[local_3c]);
        }
        pmVar2 = mpc_err_count(i,(mpc_err_t *)local_98[local_38],(p->data).repeat.n);
        r->error = pmVar2;
        if (4 < (p->data).repeat.n) {
          mpc_free(i,local_98);
        }
        i_local._4_4_ = 0;
      }
      break;
    case '\x17':
      if ((p->data).repeat.n == 0) {
        r->error = (mpc_err_t *)0x0;
        i_local._4_4_ = 1;
      }
      else {
        if ((p->data).repeat.n < 5) {
          local_a0 = &results;
        }
        else {
          local_a0 = (mpc_result_t **)mpc_malloc(i,(long)(p->data).repeat.n << 3);
        }
        for (local_38 = 0; local_38 < (p->data).repeat.n; local_38 = local_38 + 1) {
          iVar1 = mpc_parse_run(i,*(mpc_parser_t **)((long)(p->data).lift.x + (long)local_38 * 8),
                                (mpc_result_t *)(local_a0 + local_38),e,depth + 1);
          if (iVar1 != 0) {
            *r = *(mpc_result_t *)(local_a0 + local_38);
            if (4 < (p->data).repeat.n) {
              mpc_free(i,local_a0);
            }
            return 1;
          }
          pmVar2 = mpc_err_merge(i,*e,(mpc_err_t *)local_a0[local_38]);
          *e = pmVar2;
        }
        r->error = (mpc_err_t *)0x0;
        if (4 < (p->data).repeat.n) {
          mpc_free(i,local_a0);
        }
        i_local._4_4_ = 0;
      }
      break;
    case '\x18':
      if ((p->data).repeat.n == 0) {
        r->error = (mpc_err_t *)0x0;
        i_local._4_4_ = 1;
      }
      else {
        if ((p->data).repeat.n < 5) {
          local_a8 = &results;
        }
        else {
          local_a8 = (mpc_result_t **)mpc_malloc(i,(long)(p->data).repeat.n << 3);
        }
        mpc_input_mark(i);
        for (local_38 = 0; local_38 < (p->data).repeat.n; local_38 = local_38 + 1) {
          iVar1 = mpc_parse_run(i,*(mpc_parser_t **)
                                   ((long)(p->data).apply_to.d + (long)local_38 * 8),
                                (mpc_result_t *)(local_a8 + local_38),e,depth + 1);
          if (iVar1 == 0) {
            mpc_input_rewind(i);
            for (local_3c = 0; local_3c < local_38; local_3c = local_3c + 1) {
              mpc_parse_dtor(i,*(mpc_dtor_t *)((p->data).check.e + (long)local_3c * 8),
                             local_a8[local_3c]);
            }
            *r = *(mpc_result_t *)(local_a8 + local_38);
            if (4 < (p->data).repeat.n) {
              mpc_free(i,local_a8);
            }
            return 0;
          }
        }
        mpc_input_unmark(i);
        pmVar5 = mpc_parse_fold(i,(p->data).repeat.f,local_38,local_a8);
        r->output = pmVar5;
        if (4 < (p->data).repeat.n) {
          mpc_free(i,local_a8);
        }
        i_local._4_4_ = 1;
      }
      break;
    case '\x19':
      iVar1 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
      if (iVar1 == 0) {
        *r = *r;
        i_local._4_4_ = 0;
      }
      else {
        iVar1 = (*(p->data).check.f)(&r->output);
        if (iVar1 == 0) {
          mpc_parse_dtor(i,(p->data).check.dx,r->output);
          pmVar2 = mpc_err_fail(i,(p->data).check.e);
          r->error = pmVar2;
          i_local._4_4_ = 0;
        }
        else {
          *r = *r;
          i_local._4_4_ = 1;
        }
      }
      break;
    case '\x1a':
      iVar1 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
      if (iVar1 == 0) {
        *r = *r;
        i_local._4_4_ = 0;
      }
      else {
        iVar1 = (*(p->data).check.f)(&r->output);
        if (iVar1 == 0) {
          mpc_parse_dtor(i,(p->data).check.dx,r->output);
          pmVar2 = mpc_err_fail(i,(p->data).check_with.e);
          r->error = pmVar2;
          i_local._4_4_ = 0;
        }
        else {
          *r = *r;
          i_local._4_4_ = 1;
        }
      }
      break;
    case '\x1b':
      iVar1 = mpc_input_soi(i,(char **)&r->error);
      if (iVar1 == 0) {
        r->error = (mpc_err_t *)0x0;
        i_local._4_4_ = 0;
      }
      else {
        *r = *r;
        i_local._4_4_ = 1;
      }
      break;
    case '\x1c':
      iVar1 = mpc_input_eoi(i,(char **)&r->error);
      if (iVar1 == 0) {
        r->error = (mpc_err_t *)0x0;
        i_local._4_4_ = 0;
      }
      else {
        *r = *r;
        i_local._4_4_ = 1;
      }
      break;
    default:
      pmVar2 = mpc_err_fail(i,"Unknown Parser Type Id!");
      r->error = pmVar2;
      i_local._4_4_ = 0;
    }
  }
  return i_local._4_4_;
}

Assistant:

static int mpc_parse_run(mpc_input_t *i, mpc_parser_t *p, mpc_result_t *r, mpc_err_t **e, int depth) {

  int j = 0, k = 0;
  mpc_result_t results_stk[MPC_PARSE_STACK_MIN];
  mpc_result_t *results;
  int results_slots = MPC_PARSE_STACK_MIN;

  if (depth == MPC_MAX_RECURSION_DEPTH)
  {
    MPC_FAILURE(mpc_err_fail(i, "Maximum recursion depth exceeded!"));
  }

  switch (p->type) {

    /* Basic Parsers */

    case MPC_TYPE_ANY:     MPC_PRIMITIVE(mpc_input_any(i, (char**)&r->output));
    case MPC_TYPE_SINGLE:  MPC_PRIMITIVE(mpc_input_char(i, p->data.single.x, (char**)&r->output));
    case MPC_TYPE_RANGE:   MPC_PRIMITIVE(mpc_input_range(i, p->data.range.x, p->data.range.y, (char**)&r->output));
    case MPC_TYPE_ONEOF:   MPC_PRIMITIVE(mpc_input_oneof(i, p->data.string.x, (char**)&r->output));
    case MPC_TYPE_NONEOF:  MPC_PRIMITIVE(mpc_input_noneof(i, p->data.string.x, (char**)&r->output));
    case MPC_TYPE_SATISFY: MPC_PRIMITIVE(mpc_input_satisfy(i, p->data.satisfy.f, (char**)&r->output));
    case MPC_TYPE_STRING:  MPC_PRIMITIVE(mpc_input_string(i, p->data.string.x, (char**)&r->output));
    case MPC_TYPE_ANCHOR:  MPC_PRIMITIVE(mpc_input_anchor(i, p->data.anchor.f, (char**)&r->output));
    case MPC_TYPE_SOI:     MPC_PRIMITIVE(mpc_input_soi(i, (char**)&r->output));
    case MPC_TYPE_EOI:     MPC_PRIMITIVE(mpc_input_eoi(i, (char**)&r->output));

    /* Other parsers */

    case MPC_TYPE_UNDEFINED: MPC_FAILURE(mpc_err_fail(i, "Parser Undefined!"));
    case MPC_TYPE_PASS:      MPC_SUCCESS(NULL);
    case MPC_TYPE_FAIL:      MPC_FAILURE(mpc_err_fail(i, p->data.fail.m));
    case MPC_TYPE_LIFT:      MPC_SUCCESS(p->data.lift.lf());
    case MPC_TYPE_LIFT_VAL:  MPC_SUCCESS(p->data.lift.x);
    case MPC_TYPE_STATE:     MPC_SUCCESS(mpc_input_state_copy(i));

    /* Application Parsers */

    case MPC_TYPE_APPLY:
      if (mpc_parse_run(i, p->data.apply.x, r, e, depth+1)) {
        MPC_SUCCESS(mpc_parse_apply(i, p->data.apply.f, r->output));
      } else {
        MPC_FAILURE(r->output);
      }

    case MPC_TYPE_APPLY_TO:
      if (mpc_parse_run(i, p->data.apply_to.x, r, e, depth+1)) {
        MPC_SUCCESS(mpc_parse_apply_to(i, p->data.apply_to.f, r->output, p->data.apply_to.d));
      } else {
        MPC_FAILURE(r->error);
      }

    case MPC_TYPE_CHECK:
      if (mpc_parse_run(i, p->data.check.x, r, e, depth+1)) {
        if (p->data.check.f(&r->output)) {
          MPC_SUCCESS(r->output);
        } else {
          mpc_parse_dtor(i, p->data.check.dx, r->output);
          MPC_FAILURE(mpc_err_fail(i, p->data.check.e));
        }
      } else {
        MPC_FAILURE(r->error);
      }

    case MPC_TYPE_CHECK_WITH:
      if (mpc_parse_run(i, p->data.check_with.x, r, e, depth+1)) {
        if (p->data.check_with.f(&r->output, p->data.check_with.d)) {
          MPC_SUCCESS(r->output);
        } else {
          mpc_parse_dtor(i, p->data.check.dx, r->output);
          MPC_FAILURE(mpc_err_fail(i, p->data.check_with.e));
        }
      } else {
        MPC_FAILURE(r->error);
      }

    case MPC_TYPE_EXPECT:
      mpc_input_suppress_enable(i);
      if (mpc_parse_run(i, p->data.expect.x, r, e, depth+1)) {
        mpc_input_suppress_disable(i);
        MPC_SUCCESS(r->output);
      } else {
        mpc_input_suppress_disable(i);
        MPC_FAILURE(mpc_err_new(i, p->data.expect.m));
      }

    case MPC_TYPE_PREDICT:
      mpc_input_backtrack_disable(i);
      if (mpc_parse_run(i, p->data.predict.x, r, e, depth+1)) {
        mpc_input_backtrack_enable(i);
        MPC_SUCCESS(r->output);
      } else {
        mpc_input_backtrack_enable(i);
        MPC_FAILURE(r->error);
      }

    /* Optional Parsers */

    /* TODO: Update Not Error Message */

    case MPC_TYPE_NOT:
      mpc_input_mark(i);
      mpc_input_suppress_enable(i);
      if (mpc_parse_run(i, p->data.not.x, r, e, depth+1)) {
        mpc_input_rewind(i);
        mpc_input_suppress_disable(i);
        mpc_parse_dtor(i, p->data.not.dx, r->output);
        MPC_FAILURE(mpc_err_new(i, "opposite"));
      } else {
        mpc_input_unmark(i);
        mpc_input_suppress_disable(i);
        MPC_SUCCESS(p->data.not.lf());
      }

    case MPC_TYPE_MAYBE:
      if (mpc_parse_run(i, p->data.not.x, r, e, depth+1)) {
        MPC_SUCCESS(r->output);
      } else {
        *e = mpc_err_merge(i, *e, r->error);
        MPC_SUCCESS(p->data.not.lf());
      }

    /* Repeat Parsers */

    case MPC_TYPE_MANY:

      results = results_stk;

      while (mpc_parse_run(i, p->data.repeat.x, &results[j], e, depth+1)) {
        j++;
        if (j == MPC_PARSE_STACK_MIN) {
          results_slots = j + j / 2;
          results = mpc_malloc(i, sizeof(mpc_result_t) * results_slots);
          memcpy(results, results_stk, sizeof(mpc_result_t) * MPC_PARSE_STACK_MIN);
        } else if (j >= results_slots) {
          results_slots = j + j / 2;
          results = mpc_realloc(i, results, sizeof(mpc_result_t) * results_slots);
        }
      }

      *e = mpc_err_merge(i, *e, results[j].error);

      MPC_SUCCESS(
        mpc_parse_fold(i, p->data.repeat.f, j, (mpc_val_t**)results);
        if (j >= MPC_PARSE_STACK_MIN) { mpc_free(i, results); });

    case MPC_TYPE_MANY1:

      results = results_stk;

      while (mpc_parse_run(i, p->data.repeat.x, &results[j], e, depth+1)) {
        j++;
        if (j == MPC_PARSE_STACK_MIN) {
          results_slots = j + j / 2;
          results = mpc_malloc(i, sizeof(mpc_result_t) * results_slots);
          memcpy(results, results_stk, sizeof(mpc_result_t) * MPC_PARSE_STACK_MIN);
        } else if (j >= results_slots) {
          results_slots = j + j / 2;
          results = mpc_realloc(i, results, sizeof(mpc_result_t) * results_slots);
        }
      }

      if (j == 0) {
        MPC_FAILURE(
          mpc_err_many1(i, results[j].error);
          if (j >= MPC_PARSE_STACK_MIN) { mpc_free(i, results); });
      } else {

        *e = mpc_err_merge(i, *e, results[j].error);

        MPC_SUCCESS(
          mpc_parse_fold(i, p->data.repeat.f, j, (mpc_val_t**)results);
          if (j >= MPC_PARSE_STACK_MIN) { mpc_free(i, results); });
      }

    case MPC_TYPE_COUNT:

      results = p->data.repeat.n > MPC_PARSE_STACK_MIN
        ? mpc_malloc(i, sizeof(mpc_result_t) * p->data.repeat.n)
        : results_stk;

      while (mpc_parse_run(i, p->data.repeat.x, &results[j], e, depth+1)) {
        j++;
        if (j == p->data.repeat.n) { break; }
      }

      if (j == p->data.repeat.n) {
        MPC_SUCCESS(
          mpc_parse_fold(i, p->data.repeat.f, j, (mpc_val_t**)results);
          if (p->data.repeat.n > MPC_PARSE_STACK_MIN) { mpc_free(i, results); });
      } else {
        for (k = 0; k < j; k++) {
          mpc_parse_dtor(i, p->data.repeat.dx, results[k].output);
        }
        MPC_FAILURE(
          mpc_err_count(i, results[j].error, p->data.repeat.n);
          if (p->data.repeat.n > MPC_PARSE_STACK_MIN) { mpc_free(i, results); });
      }

    /* Combinatory Parsers */

    case MPC_TYPE_OR:

      if (p->data.or.n == 0) { MPC_SUCCESS(NULL); }

      results = p->data.or.n > MPC_PARSE_STACK_MIN
        ? mpc_malloc(i, sizeof(mpc_result_t) * p->data.or.n)
        : results_stk;

      for (j = 0; j < p->data.or.n; j++) {
        if (mpc_parse_run(i, p->data.or.xs[j], &results[j], e, depth+1)) {
          MPC_SUCCESS(results[j].output;
            if (p->data.or.n > MPC_PARSE_STACK_MIN) { mpc_free(i, results); });
        } else {
          *e = mpc_err_merge(i, *e, results[j].error);
        }
      }

      MPC_FAILURE(NULL;
        if (p->data.or.n > MPC_PARSE_STACK_MIN) { mpc_free(i, results); });

    case MPC_TYPE_AND:

      if (p->data.and.n == 0) { MPC_SUCCESS(NULL); }

      results = p->data.or.n > MPC_PARSE_STACK_MIN
        ? mpc_malloc(i, sizeof(mpc_result_t) * p->data.or.n)
        : results_stk;

      mpc_input_mark(i);
      for (j = 0; j < p->data.and.n; j++) {
        if (!mpc_parse_run(i, p->data.and.xs[j], &results[j], e, depth+1)) {
          mpc_input_rewind(i);
          for (k = 0; k < j; k++) {
            mpc_parse_dtor(i, p->data.and.dxs[k], results[k].output);
          }
          MPC_FAILURE(results[j].error;
            if (p->data.or.n > MPC_PARSE_STACK_MIN) { mpc_free(i, results); });
        }
      }
      mpc_input_unmark(i);
      MPC_SUCCESS(
        mpc_parse_fold(i, p->data.and.f, j, (mpc_val_t**)results);
        if (p->data.or.n > MPC_PARSE_STACK_MIN) { mpc_free(i, results); });

    /* End */

    default:

      MPC_FAILURE(mpc_err_fail(i, "Unknown Parser Type Id!"));
  }

  return 0;

}